

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::benchmarkPreparing(ConsoleReporter *this,StringRef name)

{
  TablePrinter *pTVar1;
  size_t sVar2;
  bool bVar3;
  string line;
  const_iterator __begin1;
  Column nameCol;
  string local_c0;
  undefined1 local_a0 [32];
  size_t local_80;
  size_t sStack_78;
  size_t local_70;
  Column local_68;
  
  lazyPrintWithoutClosingBenchmarkTable(this);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,name.m_start,name.m_start + name.m_size);
  local_a0._0_8_ = (Column *)(local_a0 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,local_c0._M_dataplus._M_p,
             local_c0._M_dataplus._M_p + local_c0._M_string_length);
  local_80 = 0x4f;
  sStack_78 = 0;
  local_70 = 0xffffffffffffffff;
  pTVar1 = (this->m_tablePrinter).m_ptr;
  if (pTVar1 == (TablePrinter *)0x0) {
    __assert_fail("m_ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                  ,0x385,
                  "T *Catch::Detail::unique_ptr<Catch::TablePrinter>::operator->() [T = Catch::TablePrinter]"
                 );
  }
  sVar2 = ((pTVar1->m_columnInfos).
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_start)->width - 2;
  if (sVar2 == 0) {
    __assert_fail("newWidth > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                  ,0x2862,"Column &Catch::TextFlow::Column::width(size_t)");
  }
  local_68.m_string._M_dataplus._M_p = (pointer)&local_68.m_string.field_2;
  local_80 = sVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,local_a0._0_8_,
             (long)&(((string *)local_a0._0_8_)->_M_dataplus)._M_p + local_a0._8_8_);
  local_68.m_initialIndent = local_70;
  local_68.m_width = local_80;
  local_68.m_indent = sStack_78;
  if ((Column *)local_a0._0_8_ != (Column *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  TextFlow::Column::const_iterator::const_iterator((const_iterator *)local_a0,&local_68);
  if ((local_a0._8_8_ != local_68.m_string._M_string_length) ||
     ((Column *)local_a0._0_8_ != &local_68)) {
    bVar3 = true;
    do {
      TextFlow::Column::const_iterator::operator*[abi_cxx11_(&local_c0,(const_iterator *)local_a0);
      if (!bVar3) {
        pTVar1 = (this->m_tablePrinter).m_ptr;
        if (pTVar1 == (TablePrinter *)0x0) goto LAB_00160954;
        operator<<(pTVar1);
        operator<<(pTVar1);
        operator<<(pTVar1);
      }
      pTVar1 = (this->m_tablePrinter).m_ptr;
      if (pTVar1 == (TablePrinter *)0x0) {
LAB_00160954:
        __assert_fail("m_ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                      ,0x37d,
                      "T &Catch::Detail::unique_ptr<Catch::TablePrinter>::operator*() [T = Catch::TablePrinter]"
                     );
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((pTVar1->m_oss).m_oss,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      operator<<(pTVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      TextFlow::Column::const_iterator::operator++((const_iterator *)local_a0);
      bVar3 = false;
    } while ((local_a0._8_8_ != local_68.m_string._M_string_length) ||
            ((Column *)local_a0._0_8_ != &local_68));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_string._M_dataplus._M_p != &local_68.m_string.field_2) {
    operator_delete(local_68.m_string._M_dataplus._M_p,
                    local_68.m_string.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ConsoleReporter::benchmarkPreparing( StringRef name ) {
	lazyPrintWithoutClosingBenchmarkTable();

	auto nameCol = TextFlow::Column( static_cast<std::string>( name ) )
                       .width( m_tablePrinter->columnInfos()[0].width - 2 );

	bool firstLine = true;
	for (auto line : nameCol) {
		if (!firstLine)
			(*m_tablePrinter) << ColumnBreak() << ColumnBreak() << ColumnBreak();
		else
			firstLine = false;

		(*m_tablePrinter) << line << ColumnBreak();
	}
}